

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_DetachItemFromObject(cJSON *object,char *string)

{
  int iVar1;
  bool bVar2;
  cJSON *local_30;
  cJSON *c;
  int i;
  char *string_local;
  cJSON *object_local;
  
  c._4_4_ = 0;
  local_30 = object->child;
  while( true ) {
    bVar2 = false;
    if (local_30 != (cJSON *)0x0) {
      iVar1 = cJSON_strcasecmp(local_30->string,string);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    c._4_4_ = c._4_4_ + 1;
    local_30 = local_30->next;
  }
  if (local_30 == (cJSON *)0x0) {
    object_local = (cJSON *)0x0;
  }
  else {
    object_local = cJSON_DetachItemFromArray(object,c._4_4_);
  }
  return object_local;
}

Assistant:

cJSON *
cJSON_DetachItemFromObject(cJSON *object, const char *string)
{
    int i = 0;
    cJSON *c = object->child;
    while (c && cJSON_strcasecmp(c->string, string))
        i++, c = c->next;
    if (c)
        return cJSON_DetachItemFromArray(object, i);
    return 0;
}